

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reddit.h
# Opt level: O0

vector<Comment,_std::allocator<Comment>_> * __thiscall
Reddit::extractComments(Reddit *this,Json *dataArray)

{
  move_iterator<__gnu_cxx::__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>_>
  __last;
  undefined1 uVar1;
  bool bVar2;
  reference this_00;
  const_reference this_01;
  Reddit *in_RDX;
  move_iterator<__gnu_cxx::__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>_>
  in_RDI;
  Json *in_stack_00000018;
  Comment *in_stack_00000020;
  vector<Comment,_std::allocator<Comment>_> subComments;
  Json replies;
  Json unparsedComment;
  Json *data;
  const_iterator __end1;
  const_iterator __begin1;
  Json *__range1;
  vector<Comment,_std::allocator<Comment>_> *comments;
  iterator in_stack_fffffffffffffda8;
  move_iterator<__gnu_cxx::__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>_>
  in_stack_fffffffffffffdb0;
  const_reference in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  undefined7 in_stack_fffffffffffffdf8;
  const_iterator __position;
  move_iterator<__gnu_cxx::__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>_>
  in_stack_fffffffffffffe38;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar3;
  
  uVar3 = 0;
  __position._M_current = (Comment *)in_RDI._M_current._M_current;
  std::vector<Comment,_std::allocator<Comment>_>::vector
            ((vector<Comment,_std::allocator<Comment>_> *)0x11cb46);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           *)in_stack_fffffffffffffda8._M_current);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         *)in_stack_fffffffffffffda8._M_current);
  while (uVar1 = nlohmann::json_abi_v3_11_2::detail::
                 iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::
                 operator!=<nlohmann::json_abi_v3_11_2::detail::iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                           ((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)in_stack_fffffffffffffdb0._M_current._M_current,
                            (iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)in_stack_fffffffffffffda8._M_current), (bool)uVar1) {
    this_00 = nlohmann::json_abi_v3_11_2::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)in_stack_fffffffffffffe38._M_current._M_current);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::operator[]<char_const>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_RDI._M_current._M_current,(char *)CONCAT17(uVar1,in_stack_fffffffffffffdf8));
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_RDI._M_current._M_current,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT17(uVar1,in_stack_fffffffffffffdf8));
    bVar2 = Comment::isCommentJson((Json *)in_RDI._M_current._M_current);
    if (bVar2) {
      Comment::Comment(in_stack_00000020,in_stack_00000018);
      std::vector<Comment,_std::allocator<Comment>_>::push_back
                ((vector<Comment,_std::allocator<Comment>_> *)
                 in_stack_fffffffffffffdb0._M_current._M_current,
                 in_stack_fffffffffffffda8._M_current);
      Comment::~Comment((Comment *)in_stack_fffffffffffffdb0._M_current._M_current);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::operator[]<char_const>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_RDI._M_current._M_current,(char *)CONCAT17(uVar1,in_stack_fffffffffffffdf8));
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_RDI._M_current._M_current,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT17(uVar1,in_stack_fffffffffffffdf8));
      in_stack_fffffffffffffdd7 =
           nlohmann::json_abi_v3_11_2::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::contains<const_char_(&)[5],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                      (char (*) [5])in_stack_fffffffffffffdc8);
      if ((bool)in_stack_fffffffffffffdd7) {
        in_stack_fffffffffffffdc8 =
             nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)in_RDI._M_current._M_current,
                        (char *)CONCAT17(uVar1,in_stack_fffffffffffffdf8));
        this_01 = nlohmann::json_abi_v3_11_2::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)in_RDI._M_current._M_current,
                             (char *)CONCAT17(uVar1,in_stack_fffffffffffffdf8));
        extractComments(in_RDX,(Json *)CONCAT17(uVar3,in_stack_ffffffffffffffe0));
        std::vector<Comment,_std::allocator<Comment>_>::end
                  ((vector<Comment,_std::allocator<Comment>_> *)in_stack_fffffffffffffda8._M_current
                  );
        __gnu_cxx::__normal_iterator<Comment_const*,std::vector<Comment,std::allocator<Comment>>>::
        __normal_iterator<Comment*>
                  ((__normal_iterator<const_Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                    *)in_stack_fffffffffffffdb0._M_current._M_current,
                   (__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_> *)
                   in_stack_fffffffffffffda8._M_current);
        std::vector<Comment,_std::allocator<Comment>_>::begin
                  ((vector<Comment,_std::allocator<Comment>_> *)in_stack_fffffffffffffda8._M_current
                  );
        in_stack_fffffffffffffe38 =
             std::
             make_move_iterator<__gnu_cxx::__normal_iterator<Comment*,std::vector<Comment,std::allocator<Comment>>>>
                       ((__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                         )in_stack_fffffffffffffda8._M_current);
        std::vector<Comment,_std::allocator<Comment>_>::end
                  ((vector<Comment,_std::allocator<Comment>_> *)in_stack_fffffffffffffda8._M_current
                  );
        in_stack_fffffffffffffdb0 =
             std::
             make_move_iterator<__gnu_cxx::__normal_iterator<Comment*,std::vector<Comment,std::allocator<Comment>>>>
                       ((__normal_iterator<Comment_*,_std::vector<Comment,_std::allocator<Comment>_>_>
                         )in_stack_fffffffffffffda8._M_current);
        __last._M_current._M_current._7_1_ = uVar1;
        __last._M_current._M_current._0_7_ = in_stack_fffffffffffffdf8;
        in_stack_fffffffffffffda8 =
             std::vector<Comment,std::allocator<Comment>>::
             insert<std::move_iterator<__gnu_cxx::__normal_iterator<Comment*,std::vector<Comment,std::allocator<Comment>>>>,void>
                       ((vector<Comment,_std::allocator<Comment>_> *)this_00,__position,in_RDI,
                        __last);
        std::vector<Comment,_std::allocator<Comment>_>::~vector
                  ((vector<Comment,_std::allocator<Comment>_> *)this_01);
      }
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)in_stack_fffffffffffffdb0._M_current._M_current);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffffdb0._M_current._M_current);
    nlohmann::json_abi_v3_11_2::detail::
    iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffdb0._M_current._M_current);
  }
  return (vector<Comment,_std::allocator<Comment>_> *)__position._M_current;
}

Assistant:

std::vector<Comment> extractComments(const Json& dataArray) const {
			std::vector<Comment> comments;

			for (const Json& data : dataArray) {
				const Json unparsedComment = data["data"];
				if (!Comment::isCommentJson(unparsedComment)) {
					continue;
				}

				comments.push_back(Comment(unparsedComment));

				const Json replies = unparsedComment["replies"];
				if (replies.contains("data")) {
					std::vector<Comment> subComments = extractComments(replies["data"]["children"]);
					comments.insert(comments.end(),
							std::make_move_iterator(subComments.begin()),
							std::make_move_iterator(subComments.end()));
				}
			}
			return comments;
		}